

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.c
# Opt level: O0

_Bool get_bool(char *value)

{
  int iVar1;
  char *in_RDI;
  int local_10;
  int local_c;
  
  iVar1 = strcmp(in_RDI,"true");
  if (iVar1 == 0) {
    local_c = 1;
  }
  else {
    iVar1 = strcmp(in_RDI,"false");
    if (iVar1 == 0) {
      local_10 = 0;
    }
    else {
      local_10 = atoi(in_RDI);
    }
    local_c = local_10;
  }
  return local_c != 0;
}

Assistant:

static bool get_bool(char const *value)
{
   return streq(value, "true") ? true
      : streq(value, "false") ? false
      : atoi(value);
}